

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O2

mat4 * mat4_identity(void)

{
  mat4 *in_RDI;
  
  in_RDI->m[0] = 1.0;
  in_RDI->m[1] = 0.0;
  in_RDI->m[2] = 0.0;
  in_RDI->m[3] = 0.0;
  in_RDI->m[4] = 0.0;
  in_RDI->m[5] = 1.0;
  in_RDI->m[6] = 0.0;
  in_RDI->m[7] = 0.0;
  in_RDI->m[8] = 0.0;
  in_RDI->m[9] = 0.0;
  in_RDI->m[10] = 1.0;
  in_RDI->m[0xb] = 0.0;
  in_RDI->m[0xc] = 0.0;
  in_RDI->m[0xd] = 0.0;
  in_RDI->m[0xe] = 0.0;
  in_RDI->m[0xf] = 1.0;
  return in_RDI;
}

Assistant:

mat4 mat4_identity(void) {
    return mat4_create(
            1.0, 0.0, 0.0, 0.0,
            0.0, 1.0, 0.0, 0.0,
            0.0, 0.0, 1.0, 0.0,
            0.0, 0.0, 0.0, 1.0);
}